

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Options * leveldb::SanitizeOptions
                    (Options *__return_storage_ptr__,string *dbname,InternalKeyComparator *icmp,
                    InternalFilterPolicy *ipolicy,Options *src)

{
  Env *pEVar1;
  int iVar2;
  size_t sVar3;
  Cache *pCVar4;
  long lVar5;
  Options *pOVar6;
  Options *pOVar7;
  long in_FS_OFFSET;
  Status local_80;
  Status local_78;
  Status s;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pOVar6 = src;
  pOVar7 = __return_storage_ptr__;
  for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
    pOVar7->comparator = pOVar6->comparator;
    pOVar6 = (Options *)&pOVar6->create_if_missing;
    pOVar7 = (Options *)&pOVar7->create_if_missing;
  }
  __return_storage_ptr__->comparator = &icmp->super_Comparator;
  if (src->filter_policy == (FilterPolicy *)0x0) {
    ipolicy = (InternalFilterPolicy *)0x0;
  }
  __return_storage_ptr__->filter_policy = &ipolicy->super_FilterPolicy;
  iVar2 = 50000;
  if (__return_storage_ptr__->max_open_files < 0xc351) {
    if (0x49 < __return_storage_ptr__->max_open_files) goto LAB_00a2bec9;
    iVar2 = 0x4a;
  }
  __return_storage_ptr__->max_open_files = iVar2;
LAB_00a2bec9:
  iVar2 = (int)__return_storage_ptr__->write_buffer_size;
  sVar3 = 0x40000000;
  if ((0x40000000 < iVar2) || (sVar3 = 0x10000, iVar2 < 0x10000)) {
    __return_storage_ptr__->write_buffer_size = sVar3;
  }
  iVar2 = (int)__return_storage_ptr__->max_file_size;
  sVar3 = 0x40000000;
  if ((0x40000000 < iVar2) || (sVar3 = 0x100000, iVar2 < 0x100000)) {
    __return_storage_ptr__->max_file_size = sVar3;
  }
  iVar2 = (int)__return_storage_ptr__->block_size;
  sVar3 = 0x400000;
  if ((0x400000 < iVar2) || (sVar3 = 0x400, iVar2 < 0x400)) {
    __return_storage_ptr__->block_size = sVar3;
  }
  if (__return_storage_ptr__->info_log == (Logger *)0x0) {
    (*src->env->_vptr_Env[9])(&local_78,src->env,dbname);
    Status::~Status(&local_78);
    pEVar1 = src->env;
    InfoLogFileName(&local_50,dbname);
    OldInfoLogFileName((string *)&s,dbname);
    (*pEVar1->_vptr_Env[0xc])(&local_80,pEVar1,&local_50,&s);
    Status::~Status(&local_80);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::string::~string((string *)&local_50);
    pEVar1 = src->env;
    InfoLogFileName(&local_50,dbname);
    (*pEVar1->_vptr_Env[0x12])(&s,pEVar1,&local_50,&__return_storage_ptr__->info_log);
    std::__cxx11::string::~string((string *)&local_50);
    if (s.state_ != (char *)0x0) {
      __return_storage_ptr__->info_log = (Logger *)0x0;
    }
    Status::~Status(&s);
  }
  if (__return_storage_ptr__->block_cache == (Cache *)0x0) {
    pCVar4 = NewLRUCache(0x800000);
    __return_storage_ptr__->block_cache = pCVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Options SanitizeOptions(const std::string& dbname,
                        const InternalKeyComparator* icmp,
                        const InternalFilterPolicy* ipolicy,
                        const Options& src) {
  Options result = src;
  result.comparator = icmp;
  result.filter_policy = (src.filter_policy != nullptr) ? ipolicy : nullptr;
  ClipToRange(&result.max_open_files, 64 + kNumNonTableCacheFiles, 50000);
  ClipToRange(&result.write_buffer_size, 64 << 10, 1 << 30);
  ClipToRange(&result.max_file_size, 1 << 20, 1 << 30);
  ClipToRange(&result.block_size, 1 << 10, 4 << 20);
  if (result.info_log == nullptr) {
    // Open a log file in the same directory as the db
    src.env->CreateDir(dbname);  // In case it does not exist
    src.env->RenameFile(InfoLogFileName(dbname), OldInfoLogFileName(dbname));
    Status s = src.env->NewLogger(InfoLogFileName(dbname), &result.info_log);
    if (!s.ok()) {
      // No place suitable for logging
      result.info_log = nullptr;
    }
  }
  if (result.block_cache == nullptr) {
    result.block_cache = NewLRUCache(8 << 20);
  }
  return result;
}